

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O0

void Js::JavascriptExceptionObject::Remove(Type *head,JavascriptExceptionObject *item)

{
  code *pcVar1;
  bool bVar2;
  JavascriptExceptionObject **ppJVar3;
  JavascriptExceptionObject *pJVar4;
  undefined4 *puVar5;
  nullptr_t local_28;
  WriteBarrierPtr *local_20;
  Type *p;
  JavascriptExceptionObject *item_local;
  Type *head_local;
  
  local_20 = (WriteBarrierPtr *)head;
  p = (Type *)item;
  item_local = (JavascriptExceptionObject *)head;
  while( true ) {
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptExceptionObject__(local_20);
    if (*ppJVar3 == (JavascriptExceptionObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                  ,0xfe,"(false)","false");
      if (bVar2) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptExceptionObject__(local_20);
    if (*ppJVar3 == (JavascriptExceptionObject *)p) break;
    pJVar4 = Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::operator->
                       ((WriteBarrierPtr<Js::JavascriptExceptionObject> *)local_20);
    local_20 = (WriteBarrierPtr *)&pJVar4->next;
  }
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::operator=
            ((WriteBarrierPtr<Js::JavascriptExceptionObject> *)local_20,p + 9);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::operator=(p + 9,&local_28);
  return;
}

Assistant:

void JavascriptExceptionObject::Remove(
        Field(JavascriptExceptionObject*)* head, JavascriptExceptionObject* item)
    {
        // Typically Insert/Remove happens in reversed order and item should be
        // the front one. Loop the whole list to prevent unexpected order messup.
        for (auto p = head; *p; p = &(*p)->next)
        {
            if (*p == item)
            {
                *p = item->next;
                item->next = nullptr;
                return;
            }
        }

        Assert(false);  // item not in list unexpected
    }